

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void sbox_s256_lowmc_255_255_4(mzd_local_t *in)

{
  word256 mask_c;
  word256 mask_a;
  longlong unaff_RBP;
  undefined1 in_stack_00000000 [24];
  mzd_local_t *in_stack_00000028;
  longlong in_stack_ffffffffffffffd0;
  word256 in_stack_ffffffffffffffd8;
  
  vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  vpunpcklqdq_avx(ZEXT816(0x9249249249249249),ZEXT816(0x4924924924924924));
  vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  vpunpcklqdq_avx(ZEXT816(0x9249249249249248),ZEXT816(0x4924924924924924));
  mask_a._8_24_ = in_stack_00000000;
  mask_a[0] = unaff_RBP;
  mask_c[1] = 0x4924924924924924;
  mask_c[0] = 0x9249249249249249;
  mask_c[2] = 0x2492492492492492;
  mask_c[3] = in_stack_ffffffffffffffd0;
  sbox_s256_lowmc_full(in_stack_00000028,mask_a,in_stack_ffffffffffffffd8,mask_c);
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void sbox_s256_lowmc_255_255_4(mzd_local_t* in) {
  sbox_s256_lowmc_full(in,
                       mm256_set_4(MASK_255_255_85_A_0, MASK_255_255_85_A_1, MASK_255_255_85_A_2,
                                   MASK_255_255_85_A_3),
                       mm256_set_4(MASK_255_255_85_B_0, MASK_255_255_85_B_1, MASK_255_255_85_B_2,
                                   MASK_255_255_85_B_3),
                       mm256_set_4(MASK_255_255_85_C_0, MASK_255_255_85_C_1, MASK_255_255_85_C_2,
                                   MASK_255_255_85_C_3));
}